

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variation.cpp
# Opt level: O3

void __thiscall
Variation::canonify(Variation *this,
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NamedDnaSequence_*,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NamedDnaSequence_*>_>_>
                   *references,bool rightmost)

{
  size_t key_hash;
  node_pointer ppVar1;
  runtime_error *this_00;
  ostringstream oss;
  string asStack_1b8 [32];
  ostringstream local_198 [376];
  
  key_hash = boost::unordered::detail::
             table<boost::unordered::detail::map<std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NamedDnaSequence_*>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NamedDnaSequence_*,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::hash((table<boost::unordered::detail::map<std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NamedDnaSequence_*>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NamedDnaSequence_*,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)references,(const_key_type *)(this + 8));
  ppVar1 = boost::unordered::detail::
           table<boost::unordered::detail::map<std::allocator<std::pair<std::__cxx11::string_const,NamedDnaSequence*>>,std::__cxx11::string,NamedDnaSequence*,boost::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
           ::find_node_impl<std::__cxx11::string,std::equal_to<std::__cxx11::string>>
                     ((table<boost::unordered::detail::map<std::allocator<std::pair<std::__cxx11::string_const,NamedDnaSequence*>>,std::__cxx11::string,NamedDnaSequence*,boost::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
                       *)references,key_hash,(const_key_type *)(this + 8),
                      (equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(references + (ulong)((byte)*references & 1) + 1));
  if (ppVar1 != (node_pointer)0x0) {
    canonify(this,*(NamedDnaSequence **)(ppVar1 + 0x30),rightmost);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Cannot find reference ",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,*(char **)(this + 8),*(long *)(this + 0x10));
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,asStack_1b8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Variation::canonify(const boost::unordered_map<std::string,NamedDnaSequence*>& references, bool rightmost) {
	typedef boost::unordered_map<string,NamedDnaSequence*>::const_iterator references_it_t;
	references_it_t it = references.find(chromosome);
	if (it == references.end()) {
		ostringstream oss;
		oss << "Cannot find reference " << chromosome;
		throw runtime_error(oss.str());
	}
	canonify(it->second, rightmost);
}